

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O3

void __thiscall leveldb::Iterator::~Iterator(Iterator *this)

{
  CleanupFunction p_Var1;
  Cleanup *pCVar2;
  Cleanup *pCVar3;
  
  this->_vptr_Iterator = (_func_int **)&PTR__Iterator_00132438;
  p_Var1 = (this->cleanup_).function;
  if (p_Var1 != (CleanupFunction)0x0) {
    (*p_Var1)((this->cleanup_).arg1,(this->cleanup_).arg2);
    pCVar3 = (this->cleanup_).next;
    while (pCVar3 != (Cleanup *)0x0) {
      (*pCVar3->function)(pCVar3->arg1,pCVar3->arg2);
      pCVar2 = pCVar3->next;
      operator_delete(pCVar3);
      pCVar3 = pCVar2;
    }
  }
  return;
}

Assistant:

Iterator::~Iterator() {
        if (cleanup_.function != NULL) {
            (*cleanup_.function)(cleanup_.arg1, cleanup_.arg2);
            for (Cleanup *c = cleanup_.next; c != NULL;) {
                (*c->function)(c->arg1, c->arg2);
                Cleanup *next = c->next;
                delete c;
                c = next;
            }
        }
    }